

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O1

void __thiscall nivalis::anon_unknown_3::Differentiator::~Differentiator(Differentiator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  pointer pdVar4;
  
  puVar2 = (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->thunks).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->vis_asts)._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->env).freg._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->env).vreg._M_t);
  puVar2 = (this->env).free_addrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->env).free_addrs.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->env).error_msg._M_dataplus._M_p;
  paVar1 = &(this->env).error_msg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>::
  ~vector(&(this->env).funcs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->env).varname);
  pdVar4 = (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)(this->env).vars.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  }
  std::
  vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  ::~vector(&this->argv);
  return;
}

Assistant:

Differentiator(const Expr::AST& ast, uint64_t var_addr,
            Environment& env, std::vector<Expr::ASTNode>& out)
        : nodes(ast), ast_root(&ast[0]), var_addr(var_addr), env(env), out(out) {
        vis_asts.insert(ast_root);
    }